

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

void Gia_ManQuantUpdateCiSupp(Gia_Man_t *p,int iObj)

{
  int iVar1;
  word *pwVar2;
  Gia_Obj_t *pObj;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pwVar2 = Gia_ManQuantInfoId(p,iObj);
  iVar1 = Abc_TtIsConst0(pwVar2,p->nSuppWords);
  if (iVar1 != 0) {
    pObj = Gia_ManObj(p,iObj);
    Gia_ManQuantSetSuppCi(p,pObj);
  }
  pwVar2 = Gia_ManQuantInfoId(p,iObj);
  iVar1 = Abc_TtIsConst0(pwVar2,p->nSuppWords);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("!Abc_TtIsConst0( Gia_ManQuantInfoId(p, iObj), p->nSuppWords )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaExist.c"
                ,0xa1,"void Gia_ManQuantUpdateCiSupp(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManQuantUpdateCiSupp( Gia_Man_t * p, int iObj )
{
    if ( Abc_TtIsConst0( Gia_ManQuantInfoId(p, iObj), p->nSuppWords ) )
        Gia_ManQuantSetSuppCi( p, Gia_ManObj(p, iObj) );
    assert( !Abc_TtIsConst0( Gia_ManQuantInfoId(p, iObj), p->nSuppWords ) );
}